

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::ShellCommand::processMakefileDiscoveredDependencies(llbuild::buildsystem::
BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::StringRef,llvm::
MemoryBuffer*,bool)::DepsActions::actOnRuleDependency(llvm::StringRef,llvm::StringRef_
          (void *this,StringRef dependency,StringRef unescapedWord)

{
  bool bVar1;
  BuildSystemDelegate *pBVar2;
  char *pcVar3;
  Twine *this_00;
  StringRef path;
  StringRef path_00;
  StringRef unescapedWord_local;
  Twine local_10b0;
  Twine local_1090;
  Twine local_1070;
  Twine local_1058;
  SmallString<4096U> absPath;
  
  unescapedWord_local.Length = unescapedWord.Length;
  pcVar3 = unescapedWord.Data;
  unescapedWord_local.Data = pcVar3;
  llvm::Twine::Twine((Twine *)&absPath,&unescapedWord_local);
  bVar1 = llvm::sys::path::is_absolute((Twine *)&absPath,native);
  if (bVar1) {
    path.Length = (size_t)pcVar3;
    path.Data = (char *)unescapedWord_local.Length;
    BuildKey::makeNode((BuildKey *)&local_10b0,(BuildKey *)unescapedWord_local.Data,path);
    std::__cxx11::string::string((string *)&absPath,(string *)&local_10b0);
    llbuild::core::TaskInterface::discoveredDependency
              ((TaskInterface *)((long)this + 0x10),(KeyType *)&absPath);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    pBVar2 = BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
    (*pBVar2->_vptr_BuildSystemDelegate[0xf])
              (pBVar2,*(undefined8 *)((long)this + 0x20),unescapedWord_local.Data,
               unescapedWord_local.Length,0);
  }
  else {
    pcVar3 = *(char **)(*(long *)((long)this + 0x20) + 0x1d8);
    llvm::SmallVector<char,4096u>::SmallVector<char_const*,void>
              (&absPath.super_SmallVector<char,_4096U>,pcVar3,
               pcVar3 + *(long *)(*(long *)((long)this + 0x20) + 0x1e0));
    llvm::Twine::Twine(&local_10b0,&unescapedWord_local);
    llvm::Twine::Twine(&local_1090,"");
    this_00 = &local_1058;
    llvm::Twine::Twine(this_00,"");
    llvm::Twine::Twine(&local_1070,"");
    llvm::sys::path::append
              (&absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>,&local_10b0,
               &local_1090,this_00,&local_1070);
    llvm::sys::fs::make_absolute
              (&absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>);
    path_00.Data = (char *)(ulong)absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>
                                  .super_SmallVectorTemplateBase<char,_true>.
                                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                  Size;
    path_00.Length = (size_t)this_00;
    BuildKey::makeNode((BuildKey *)&local_1090,
                       (BuildKey *)
                       absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                       super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                       path_00);
    std::__cxx11::string::string((string *)&local_10b0,(string *)&local_1090);
    llbuild::core::TaskInterface::discoveredDependency
              ((TaskInterface *)((long)this + 0x10),(KeyType *)&local_10b0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    pBVar2 = BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
    (*pBVar2->_vptr_BuildSystemDelegate[0xf])
              (pBVar2,*(undefined8 *)((long)this + 0x20),
               absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.BeginX,
               (ulong)absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                      super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size,0);
    llvm::SmallVectorImpl<char>::~SmallVectorImpl
              (&absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>);
  }
  return;
}

Assistant:

virtual void actOnRuleDependency(StringRef dependency,
                                     StringRef unescapedWord) override {
      if (llvm::sys::path::is_absolute(unescapedWord)) {
        ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, unescapedWord, DiscoveredDependencyKind::Input);
        return;
      }

      // Generate absolute path
      //
      // NOTE: This is making the assumption that relative paths coming in a
      // dependency file are in relation to the explictly set working
      // directory, or the current working directory when it has not been set.
      SmallString<PATH_MAX> absPath = StringRef(command->workingDirectory);
      llvm::sys::path::append(absPath, unescapedWord);
      llvm::sys::fs::make_absolute(absPath);

      ti.discoveredDependency(BuildKey::makeNode(absPath).toData());
      system.getDelegate().commandFoundDiscoveredDependency(command, absPath, DiscoveredDependencyKind::Input);
    }